

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O2

Result * validateWeightParamsUpdatable(Result *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  ConvolutionLayerParams *pCVar1;
  byte bVar2;
  RepeatedField<unsigned_long> *pRVar3;
  byte bVar4;
  bool bVar5;
  undefined1 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Result r;
  
  CoreML::Result::Result(&r);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x8c) {
    pCVar1 = (layer->layer_).convolution_;
    bVar2 = *(byte *)&(pCVar1->stride_).arena_or_elements_;
    if (bVar2 == 1) {
      puVar6 = (undefined1 *)(pCVar1->kernelsize_).arena_or_elements_;
      if (puVar6 == (undefined1 *)0x0) {
        puVar6 = CoreML::Specification::_WeightParams_default_instance_;
      }
      bVar4 = puVar6[0x40];
      bVar5 = *(long *)(puVar6 + 0x38) != 0 &&
              puVar6 != CoreML::Specification::_WeightParams_default_instance_;
    }
    else {
      bVar4 = 0;
      bVar5 = false;
    }
    pRVar3 = &pCVar1->kernelsize_;
LAB_0027cea7:
    puVar6 = *(undefined1 **)pRVar3;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = CoreML::Specification::_WeightParams_default_instance_;
    }
    if ((puVar6 != CoreML::Specification::_WeightParams_default_instance_ &&
         ((WeightParams *)puVar6)->quantization_ != (QuantizationParams *)0x0) || (bVar5)) {
      std::operator+(&bStack_98,"An updatable layer, named \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&local_58,&bStack_98,
                     "\', has quantized weights/bias param. Quantized weights/bias not supported for update."
                    );
    }
    else {
      if (((byte)(bVar4 | bVar2 ^ 1) == 1) && (((WeightParams *)puVar6)->isupdatable_ != false))
      goto LAB_0027cee1;
      std::operator+(&bStack_98,"An updatable layer, named \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&local_58,&bStack_98,
                     "\', has a weight/bias param which is not marked as updatable.");
    }
    std::__cxx11::string::operator=((string *)&err,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&bStack_98);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,&err);
  }
  else {
    if (layer->_oneof_case_[0] == 100) {
      pCVar1 = (layer->layer_).convolution_;
      bVar2 = pCVar1->hasbias_;
      if ((bool)bVar2 == true) {
        puVar6 = (undefined1 *)pCVar1->bias_;
        if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
          puVar6 = CoreML::Specification::_WeightParams_default_instance_;
        }
        bVar4 = ((WeightParams *)puVar6)->isupdatable_;
        bVar5 = ((WeightParams *)puVar6)->quantization_ != (QuantizationParams *)0x0 &&
                puVar6 != CoreML::Specification::_WeightParams_default_instance_;
      }
      else {
        bVar4 = 0;
        bVar5 = false;
      }
      pRVar3 = (RepeatedField<unsigned_long> *)&pCVar1->weights_;
      goto LAB_0027cea7;
    }
LAB_0027cee1:
    CoreML::Result::Result(__return_storage_ptr__,&r);
  }
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

static Result validateWeightParamsUpdatable(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    
    bool weight_update_flag = false;
    bool bias_update_flag = false;
    bool has_bias = false;
    bool weights_are_quantized = false;
    bool bias_is_quantized = false;
    
    std::string err;
    
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::kConvolution:
            has_bias = layer.convolution().hasbias();
            if (has_bias) {
                bias_update_flag = layer.convolution().bias().isupdatable();
                bias_is_quantized = layer.convolution().bias().has_quantization();
            }
            weights_are_quantized = layer.convolution().weights().has_quantization();
            weight_update_flag = layer.convolution().weights().isupdatable();
            break;
        case Specification::NeuralNetworkLayer::kInnerProduct:
            has_bias = layer.innerproduct().hasbias();
            if (has_bias) {
                bias_update_flag = layer.innerproduct().bias().isupdatable();
                bias_is_quantized = layer.innerproduct().bias().has_quantization();
            }
            weights_are_quantized = layer.innerproduct().weights().has_quantization();
            weight_update_flag = layer.innerproduct().weights().isupdatable();
            break;
        default:
            return r;
    }

    if (weights_are_quantized || bias_is_quantized) {
        err = "An updatable layer, named '" + layer.name() + "', has quantized weights/bias param. Quantized weights/bias not supported for update.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    if (!weight_update_flag || ((has_bias) && (!bias_update_flag))) {
        err = "An updatable layer, named '" + layer.name() + "', has a weight/bias param which is not marked as updatable.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    return r;
}